

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForTorCorrFunc.cpp
# Opt level: O1

void __thiscall
OpenMD::ForTorCorrFunc::validateSelection(ForTorCorrFunc *this,SelectionManager *seleMan)

{
  uint uVar1;
  StuntDouble *pSVar2;
  int i;
  int local_54;
  long *local_50 [2];
  long local_40 [2];
  
  pSVar2 = SelectionManager::beginSelected(seleMan,&local_54);
  if (pSVar2 != (StuntDouble *)0x0) {
    do {
      if (1 < pSVar2->objType_ - otDAtom) {
        uVar1 = pSVar2->globalIndex_;
        (*pSVar2->_vptr_StuntDouble[7])(local_50,pSVar2);
        snprintf(painCave.errMsg,2000,
                 "ForTorCorrFunc::validateSelection Error: selection %d (%s)\n\t is not a Directional object\n"
                 ,(ulong)uVar1,local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        painCave.isFatal = 1;
        simError();
      }
      pSVar2 = SelectionManager::nextSelected(seleMan,&local_54);
    } while (pSVar2 != (StuntDouble *)0x0);
  }
  return;
}

Assistant:

void ForTorCorrFunc::validateSelection(SelectionManager& seleMan) {
    StuntDouble* sd;
    int i;

    for (sd = seleMan.beginSelected(i); sd != NULL;
         sd = seleMan.nextSelected(i)) {
      if (!sd->isDirectional()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForTorCorrFunc::validateSelection Error: selection "
                 "%d (%s)\n"
                 "\t is not a Directional object\n",
                 sd->getGlobalIndex(), sd->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }